

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O1

void outputHandleMode(void *userData,wl_output *output,uint32_t flags,int32_t width,int32_t height,
                     int32_t refresh)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  double dVar4;
  
  dVar4 = round((double)refresh / 1000.0);
  iVar1 = *(int *)((long)userData + 0xa0);
  *(int *)((long)userData + 0xa0) = iVar1 + 1;
  pvVar2 = _glfw_realloc(*(void **)((long)userData + 0x98),((long)iVar1 * 8 + 8) * 3);
  *(void **)((long)userData + 0x98) = pvVar2;
  lVar3 = (long)*(int *)((long)userData + 0xa0);
  *(int32_t *)((long)pvVar2 + lVar3 * 0x18 + -0x18) = width;
  *(int32_t *)((long)pvVar2 + lVar3 * 0x18 + -0x14) = height;
  *(undefined8 *)((long)pvVar2 + lVar3 * 0x18 + -0x10) = 0x800000008;
  *(undefined4 *)((long)pvVar2 + lVar3 * 0x18 + -8) = 8;
  *(int *)((long)pvVar2 + lVar3 * 0x18 + -4) = (int)dVar4;
  if ((flags & 1) != 0) {
    *(int *)((long)userData + 0x10c) = *(int *)((long)userData + 0xa0) + -1;
  }
  return;
}

Assistant:

static void outputHandleMode(void* userData,
                             struct wl_output* output,
                             uint32_t flags,
                             int32_t width,
                             int32_t height,
                             int32_t refresh)
{
    struct _GLFWmonitor* monitor = userData;
    GLFWvidmode mode;

    mode.width = width;
    mode.height = height;
    mode.redBits = 8;
    mode.greenBits = 8;
    mode.blueBits = 8;
    mode.refreshRate = (int) round(refresh / 1000.0);

    monitor->modeCount++;
    monitor->modes =
        _glfw_realloc(monitor->modes, monitor->modeCount * sizeof(GLFWvidmode));
    monitor->modes[monitor->modeCount - 1] = mode;

    if (flags & WL_OUTPUT_MODE_CURRENT)
        monitor->wl.currentMode = monitor->modeCount - 1;
}